

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void SystemZ_printInst(MCInst *MI,SStream *O,void *Info)

{
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  printInstruction(MI,O,(MCRegisterInfo *)Info);
  return;
}

Assistant:

void SystemZ_printInst(MCInst *MI, SStream *O, void *Info)
{
	printInstruction(MI, O, Info);
}